

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

void __thiscall ncnn::Convolution1D::Convolution1D(Convolution1D *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Convolution1D_009f7698;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x1f));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x29));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x32));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Convolution1D::Convolution1D()
{
    one_blob_only = true;
    support_inplace = false;
}